

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

int Aig_ObjIsExorType(Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Obj_t **ppFan0,Aig_Obj_t **ppFan1)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t **ppFan1_local;
  Aig_Obj_t **ppFan0_local;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  
  iVar1 = Aig_IsComplement(p0);
  if ((iVar1 == 0) || (iVar1 = Aig_IsComplement(p1), iVar1 == 0)) {
    return 0;
  }
  pAVar3 = Aig_Regular(p0);
  pAVar4 = Aig_Regular(p1);
  iVar1 = Aig_ObjIsAnd(pAVar3);
  if ((iVar1 != 0) && (iVar1 = Aig_ObjIsAnd(pAVar4), iVar1 != 0)) {
    pAVar5 = Aig_ObjFanin0(pAVar3);
    pAVar6 = Aig_ObjFanin0(pAVar4);
    if (pAVar5 == pAVar6) {
      pAVar5 = Aig_ObjFanin1(pAVar3);
      pAVar6 = Aig_ObjFanin1(pAVar4);
      if (pAVar5 == pAVar6) {
        iVar1 = Aig_ObjFaninC0(pAVar3);
        iVar2 = Aig_ObjFaninC0(pAVar4);
        if (iVar1 != iVar2) {
          iVar1 = Aig_ObjFaninC1(pAVar3);
          iVar2 = Aig_ObjFaninC1(pAVar4);
          if (iVar1 != iVar2) {
            pAVar4 = Aig_ObjChild0(pAVar3);
            *ppFan0 = pAVar4;
            pAVar3 = Aig_ObjChild1(pAVar3);
            *ppFan1 = pAVar3;
            return 1;
          }
        }
        return 0;
      }
    }
    return 0;
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// procedure to detect an EXOR gate
static inline int Aig_ObjIsExorType( Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Obj_t ** ppFan0, Aig_Obj_t ** ppFan1 )
{
    if ( !Aig_IsComplement(p0) || !Aig_IsComplement(p1) )
        return 0;
    p0 = Aig_Regular(p0);
    p1 = Aig_Regular(p1);
    if ( !Aig_ObjIsAnd(p0) || !Aig_ObjIsAnd(p1) )
        return 0;
    if ( Aig_ObjFanin0(p0) != Aig_ObjFanin0(p1) || Aig_ObjFanin1(p0) != Aig_ObjFanin1(p1) )
        return 0;
    if ( Aig_ObjFaninC0(p0) == Aig_ObjFaninC0(p1) || Aig_ObjFaninC1(p0) == Aig_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Aig_ObjChild0(p0);
    *ppFan1 = Aig_ObjChild1(p0);
    return 1;
}